

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O0

float Assimp::getWeightAtKey
                (vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_> *values,
                int key,uint value)

{
  const_reference pvVar1;
  size_type sVar2;
  const_reference pvVar3;
  uint local_24;
  uint i;
  uint value_local;
  int key_local;
  vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_> *values_local;
  
  local_24 = 0;
  while( true ) {
    pvVar1 = std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>::
             operator[](values,(long)key);
    sVar2 = std::vector<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
            ::size(&pvVar1->mKeys);
    if (sVar2 <= local_24) {
      return 0.0;
    }
    pvVar1 = std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>::
             operator[](values,(long)key);
    pvVar3 = std::
             vector<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>::
             operator[](&pvVar1->mKeys,(ulong)local_24);
    if (pvVar3->mValue == value) break;
    local_24 = local_24 + 1;
  }
  pvVar1 = std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>::
           operator[](values,(long)key);
  pvVar3 = std::vector<Assimp::MorphTimeValues::key,_std::allocator<Assimp::MorphTimeValues::key>_>
           ::operator[](&pvVar1->mKeys,(ulong)local_24);
  return pvVar3->mWeight;
}

Assistant:

float getWeightAtKey(const std::vector<MorphTimeValues> &values, int key, unsigned int value)
{
    for (unsigned int i = 0; i < values[key].mKeys.size(); i++)
    {
        if (values[key].mKeys[i].mValue == value)
            return values[key].mKeys[i].mWeight;
    }
    // no value at key found, try to interpolate if present at other keys. if not, return zero
    // TODO: interpolation
    return 0.0f;
}